

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DemoPlayer.cpp
# Opt level: O0

void __thiscall DemoPlayer::play(DemoPlayer *this,uint songNumber)

{
  Bit8u *pBVar1;
  QString *s2;
  MasterClockNanos MVar2;
  QString local_a0;
  QString local_78;
  QString local_60;
  QString local_48;
  QString local_30;
  uint local_14;
  DemoPlayer *pDStack_10;
  uint songNumber_local;
  DemoPlayer *this_local;
  
  local_14 = songNumber;
  pDStack_10 = this;
  QList<QMidiEvent>::clear(&(this->midiEventList).super_QVector<QMidiEvent>);
  if (local_14 < this->demoSongCount) {
    this->currentSongNumber = local_14;
    pBVar1 = getSongData(this,local_14);
    this->songData = pBVar1;
    QString::QString(&local_78);
    s2 = QString::setNum(&local_78,local_14 + 1,10);
    ::operator+(&local_60,"Demo ",s2);
    ::operator+(&local_48,&local_60,": ");
    getSongName(&local_a0,this->songData);
    ::operator+(&local_30,&local_48,&local_a0);
    QString::operator=(&this->midiStreamName,(QString *)&local_30);
    QString::~QString(&local_30);
    QString::~QString(&local_a0);
    QString::~QString(&local_48);
    QString::~QString(&local_60);
    QString::~QString(&local_78);
    MVar2 = computeMidiTick(this->songData);
    this->midiTick = MVar2;
    configureSynth(this);
    parseMIDIEvents(this,this->songData + 0x120);
    SMFDriver::start(&this->smfDriver,&this->super_MidiStreamSource);
  }
  return;
}

Assistant:

void DemoPlayer::play(uint songNumber) {
	midiEventList.clear();
	if (demoSongCount <= songNumber) return;
	currentSongNumber = songNumber;
	songData = getSongData(songNumber);
	midiStreamName = "Demo " + QString().setNum(songNumber + 1) + ": " + getSongName(songData);
	midiTick = computeMidiTick(songData);
	configureSynth();
	parseMIDIEvents(&songData[MIDI_STREAM_OFFSET]);
	smfDriver.start(this);
}